

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::BindingImageAPIOverrideTest::prepareUniforms
          (BindingImageAPIOverrideTest *this,program *program)

{
  int iVar1;
  GLint GVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  GLint binding;
  buffer local_40;
  long lVar3;
  
  iVar1 = (*((this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.super_TestCase.
            m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  GVar2 = Utils::program::getUniformLocation(program,"goku");
  (**(code **)(lVar3 + 0x14f0))(GVar2,7);
  binding = -1;
  (**(code **)(lVar3 + 0xb68))(program->m_program_object_id,GVar2,&binding);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"getUniformiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x32f0);
  if (binding == 7) {
    local_40.m_context =
         (this->super_BindingImageTest).super_GLSLTestBase.super_TestBase.super_TestCase.m_context;
    local_40.m_id = 0;
    local_40.m_target = 0;
    BindingImageTest::prepareTexture
              (&this->super_BindingImageTest,&this->m_goku_texture,&local_40,TEX_2D,0xff,7);
    Utils::buffer::~buffer(&local_40);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Wrong binding value",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x32f4);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BindingImageAPIOverrideTest::prepareUniforms(Utils::program& program)
{
	static const GLuint goku_data   = 0x000000ff;
	static const GLint  new_binding = 7;

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const GLint uniform_location = program.getUniformLocation("goku");
	if (-1 == uniform_location)
	{
		TCU_FAIL("Uniform is inactive");
	}

	gl.uniform1i(uniform_location, new_binding);

	GLint binding = -1;

	gl.getUniformiv(program.m_program_object_id, uniform_location, &binding);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getUniformiv");

	if (new_binding != binding)
	{
		TCU_FAIL("Wrong binding value");
		return;
	}

	prepareTexture(m_goku_texture, Utils::buffer(m_context), Utils::TEX_2D, goku_data, new_binding);
}